

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void sexp_mark_one(sexp_conflict ctx,sexp_conflict *types,sexp_conflict x)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  sexp_uint_t sVar4;
  sexp_conflict psVar5;
  sexp_conflict start;
  sexp_conflict *in_RDX;
  sexp_conflict in_RSI;
  bool bVar6;
  sexp_gc_var_t *saves;
  sexp_conflict *q;
  sexp_conflict *p;
  sexp_conflict t;
  sexp_sint_t len;
  sexp_conflict *in_stack_ffffffffffffffc0;
  sexp_conflict in_stack_ffffffffffffffe0;
  
  while( true ) {
    if (((in_RDX == (sexp_conflict *)0x0) || (((ulong)in_RDX & 3) != 0)) ||
       (*(char *)((long)in_RDX + 4) != '\0')) {
      return;
    }
    *(undefined1 *)((long)in_RDX + 4) = 1;
    if ((((ulong)in_RDX & 3) == 0) && (*(uint *)in_RDX == 0x24)) {
      for (psVar5 = in_RDX[0xc10]; psVar5 != (sexp_conflict)0x0; psVar5 = (psVar5->value).type.name)
      {
        lVar2._0_4_ = psVar5->tag;
        lVar2._4_1_ = psVar5->markedp;
        lVar2._5_3_ = *(undefined3 *)&psVar5->field_0x5;
        if (lVar2 != 0) {
          sexp_mark_one(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
        }
      }
      in_stack_ffffffffffffffc0 = (sexp_conflict *)0x0;
    }
    lVar2 = *(long *)(&in_RSI->tag + (ulong)*(uint *)in_RDX * 2);
    in_stack_ffffffffffffffe0 =
         (sexp_conflict)
         (*(long *)((long)in_RDX + (long)(int)*(short *)(lVar2 + 0x5a)) *
          (ulong)*(ushort *)(lVar2 + 0x5c) + (long)*(short *)(lVar2 + 0x58) + -1);
    if ((long)in_stack_ffffffffffffffe0 < 0) break;
    psVar5 = (sexp_conflict)((long)in_RDX + (long)(int)*(short *)(lVar2 + 0x54));
    start = (sexp_conflict)((long)psVar5 + (long)in_stack_ffffffffffffffe0 * 8);
    while( true ) {
      bVar6 = false;
      if (psVar5 < start) {
        uVar3._0_4_ = start->tag;
        uVar3._4_1_ = start->markedp;
        uVar3._5_3_ = *(undefined3 *)&start->field_0x5;
        if ((uVar3 == 0) ||
           (((undefined1  [24776])*start & (undefined1  [24776])0x3) != (undefined1  [24776])0x0)) {
          cVar1 = '\x01';
        }
        else {
          cVar1 = *(char *)(*(ulong *)start + 4);
        }
        bVar6 = cVar1 != '\0';
      }
      if (!bVar6) break;
      start = (sexp_conflict)&start[-1].value.context.gc_usecs;
    }
    while( true ) {
      bVar6 = false;
      if (psVar5 < start) {
        sVar4._0_4_ = start->tag;
        sVar4._4_1_ = start->markedp;
        sVar4._5_3_ = *(undefined3 *)&start->field_0x5;
        bVar6 = sVar4 == start[-1].value.context.gc_usecs;
      }
      if (!bVar6) break;
      start = (sexp_conflict)&start[-1].value.context.gc_usecs;
    }
    if (psVar5 < start) {
      sexp_mark_stack_push(psVar5,(sexp_conflict *)start,in_stack_ffffffffffffffc0);
    }
    in_RDX = *(sexp_conflict **)start;
  }
  return;
}

Assistant:

static void sexp_mark_one (sexp ctx, sexp* types, sexp x) {
  sexp_sint_t len;
  sexp t, *p, *q;
  struct sexp_gc_var_t *saves;
 loop:
  if (!x || !sexp_pointerp(x) || !sexp_valid_object_p(ctx, x) || sexp_markedp(x))
    return;
  sexp_markedp(x) = 1;
  if (sexp_contextp(x)) {
    for (saves=sexp_context_saves(x); saves; saves=saves->next)
      if (saves->var) sexp_mark_one(ctx, types, *(saves->var));
  }
  t = types[sexp_pointer_tag(x)];
  len = sexp_type_num_slots_of_object(t, x) - 1;
  if (len >= 0) {
    p = (sexp*) (((char*)x) + sexp_type_field_base(t));
    q = p + len;
    while (p < q && (*q && sexp_pointerp(*q) ? sexp_markedp(*q) : 1))
      q--;                      /* skip trailing immediates */
    while (p < q && *q == q[-1])
      q--;                      /* skip trailing duplicates */
    if (p < q) {
      sexp_mark_stack_push(ctx, p, q);
    }
    x = *q;
    goto loop;
  }
}